

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_timer.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar2;
  runtime_error *prVar3;
  ptime pVar5;
  ptime pVar6;
  ptime pVar7;
  ptime pVar8;
  ptime pVar9;
  time1 func;
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  deadline_timer t2;
  io_service srv;
  deadline_timer timer;
  ostringstream oss;
  undefined1 local_230 [12];
  deadline_timer local_220 [40];
  io_service local_1f8 [16];
  deadline_timer local_1e8 [40];
  ptime local_1c0 [23];
  string local_48 [32];
  long lVar1;
  int iVar4;
  
  booster::aio::deadline_timer::deadline_timer(local_1e8);
  auVar10 = booster::ptime::now();
  iVar4 = auVar10._8_4_;
  lVar1 = auVar10._0_8_;
  local_230._0_8_ = 0;
  local_230._8_4_ = 0;
  booster::ptime::normalize((ptime *)local_230);
  local_1c0[0].sec = 1;
  local_1c0[0].nsec = 0;
  booster::ptime::normalize(local_1c0);
  local_1c0[0].sec = local_1c0[0].sec + lVar1;
  local_1c0[0].nsec = local_1c0[0].nsec + iVar4;
  booster::ptime::normalize(local_1c0);
  pVar5._8_8_ = local_1c0[0].sec;
  pVar5.sec = (longlong)local_1e8;
  booster::aio::deadline_timer::expires_at(pVar5);
  auVar11 = booster::aio::deadline_timer::expires_at();
  local_1c0[0].sec = 1;
  local_1c0[0].nsec = 0;
  booster::ptime::normalize(local_1c0);
  local_1c0[0].sec = local_1c0[0].sec + lVar1;
  local_1c0[0].nsec = local_1c0[0].nsec + iVar4;
  booster::ptime::normalize(local_1c0);
  auVar10._8_4_ = local_1c0[0].nsec;
  auVar10._0_8_ = local_1c0[0].sec;
  if (auVar11 != auVar10) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," timer.expires_at() == now + ptime::seconds(1)",0x2e);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_220);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_230 = booster::aio::deadline_timer::expires_from_now();
  local_1c0[0].sec = 1;
  local_1c0[0].nsec = 0;
  booster::ptime::normalize(local_1c0);
  if (((long)local_230._0_8_ <= local_1c0[0].sec) &&
     (((long)local_230._0_8_ < local_1c0[0].sec || ((int)local_230._8_4_ <= local_1c0[0].nsec)))) {
    local_1c0[0].sec = 0;
    local_1c0[0].nsec = 900000000;
    booster::ptime::normalize(local_1c0);
    if ((local_1c0[0].sec <= (long)local_230._0_8_) &&
       ((local_1c0[0].sec < (long)local_230._0_8_ || (local_1c0[0].nsec <= (int)local_230._8_4_))))
    {
      local_1c0[0].sec = 2;
      local_1c0[0].nsec = 0;
      booster::ptime::normalize(local_1c0);
      pVar6._8_8_ = local_1c0[0].sec;
      pVar6.sec = (longlong)local_1e8;
      booster::aio::deadline_timer::expires_from_now(pVar6);
      auVar10 = booster::aio::deadline_timer::expires_at();
      local_1c0[0].sec = 2;
      local_1c0[0].nsec = 0;
      local_230 = auVar10;
      booster::ptime::normalize(local_1c0);
      local_1c0[0].sec = local_1c0[0].sec + lVar1;
      local_1c0[0].nsec = local_1c0[0].nsec + iVar4;
      booster::ptime::normalize(local_1c0);
      if (((long)local_230._0_8_ < local_1c0[0].sec) ||
         (((long)local_230._0_8_ <= local_1c0[0].sec && ((int)local_230._8_4_ < local_1c0[0].nsec)))
         ) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x35);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2," (tmp = timer.expires_at()) >= now + ptime::seconds(2)",0x36);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,(string *)local_220);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_1c0[0].sec = 2;
      local_1c0[0].nsec = 100000000;
      booster::ptime::normalize(local_1c0);
      local_1c0[0].sec = lVar1 + local_1c0[0].sec;
      local_1c0[0].nsec = iVar4 + local_1c0[0].nsec;
      booster::ptime::normalize(local_1c0);
      if ((local_1c0[0].sec < (long)local_230._0_8_) ||
         ((local_1c0[0].sec <= (long)local_230._0_8_ && (local_1c0[0].nsec < (int)local_230._8_4_)))
         ) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x36);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2," tmp <= now + ptime::milliseconds(2100)",0x27);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,(string *)local_220);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      auVar10 = booster::aio::deadline_timer::expires_from_now();
      local_1c0[0].sec = 2;
      local_1c0[0].nsec = 0;
      local_230 = auVar10;
      booster::ptime::normalize(local_1c0);
      if (((long)local_230._0_8_ <= local_1c0[0].sec) &&
         (((long)local_230._0_8_ < local_1c0[0].sec || ((int)local_230._8_4_ <= local_1c0[0].nsec)))
         ) {
        local_1c0[0].sec = 1;
        local_1c0[0].nsec = 900000000;
        booster::ptime::normalize(local_1c0);
        if ((local_1c0[0].sec <= (long)local_230._0_8_) &&
           ((local_1c0[0].sec < (long)local_230._0_8_ || (local_1c0[0].nsec <= (int)local_230._8_4_)
            ))) {
          auVar10 = booster::ptime::now();
          local_1c0[0].sec = 0;
          local_1c0[0].nsec = 100000000;
          booster::ptime::normalize(local_1c0);
          pVar7._8_8_ = local_1c0[0].sec;
          pVar7.sec = (longlong)local_1e8;
          booster::aio::deadline_timer::expires_from_now(pVar7);
          booster::aio::deadline_timer::wait();
          auVar11 = booster::ptime::now();
          local_1c0[0].sec = auVar11._0_8_ - auVar10._0_8_;
          local_1c0[0].nsec = auVar11._8_4_ - auVar10._8_4_;
          booster::ptime::normalize(local_1c0);
          local_230._0_8_ = local_1c0[0].sec;
          local_230._8_4_ = local_1c0[0].nsec;
          local_1c0[0].sec = 0;
          local_1c0[0].nsec = 100000000;
          booster::ptime::normalize(local_1c0);
          if (((long)local_230._0_8_ < local_1c0[0].sec) ||
             (((long)local_230._0_8_ <= local_1c0[0].sec &&
              ((int)local_230._8_4_ < local_1c0[0].nsec)))) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                       ,0x6c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
            poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x3c);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar2," (tmp = (booster::ptime::now() - now)) >= ptime::milliseconds(100)",
                       0x42);
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar3,(string *)local_220);
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          local_1c0[0].sec = 0;
          local_1c0[0].nsec = 300000000;
          booster::ptime::normalize(local_1c0);
          if ((local_1c0[0].sec <= (long)local_230._0_8_) &&
             ((local_1c0[0].sec < (long)local_230._0_8_ ||
              (local_1c0[0].nsec <= (int)local_230._8_4_)))) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                       ,0x6c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
            poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x3d);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar2," tmp < ptime::milliseconds(300)",0x1f);
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar3,(string *)local_220);
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          booster::aio::io_service::io_service(local_1f8);
          booster::aio::deadline_timer::set_io_service((io_service *)local_1e8);
          booster::aio::deadline_timer::deadline_timer(local_220,local_1f8);
          auVar10 = booster::ptime::now();
          local_1c0[0].sec = 2;
          local_1c0[0].nsec = 0;
          booster::ptime::normalize(local_1c0);
          pVar8._8_8_ = local_1c0[0].sec;
          pVar8.sec = (longlong)local_220;
          booster::aio::deadline_timer::expires_from_now(pVar8);
          local_1c0[0].sec = 0;
          local_1c0[0].nsec = 100000000;
          booster::ptime::normalize(local_1c0);
          pVar9._8_8_ = local_1c0[0].sec;
          pVar9.sec = (longlong)local_1e8;
          booster::aio::deadline_timer::expires_from_now(pVar9);
          func.timer2 = local_220;
          func.srv = local_1f8;
          booster::callback<void_(const_std::error_code_&)>::callback<time1>
                    ((callback<void_(const_std::error_code_&)> *)local_1c0,func);
          booster::aio::deadline_timer::async_wait((callback *)local_1e8);
          booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                    ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)local_1c0)
          ;
          booster::callback<void_(const_std::error_code_&)>::callback<time2>
                    ((callback<void_(const_std::error_code_&)> *)local_1c0,local_1f8);
          booster::aio::deadline_timer::async_wait((callback *)local_220);
          booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                    ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)local_1c0)
          ;
          booster::aio::io_service::run();
          if ((occured2_at.sec < occured1_at.sec) ||
             ((occured2_at.sec <= occured1_at.sec && (occured2_at.nsec < occured1_at.nsec)))) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                       ,0x6c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
            poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x4d);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar2," occured2_at >= occured1_at",0x1b);
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar3,local_48);
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          local_1c0[0].sec = 0;
          local_1c0[0].nsec = 100000000;
          booster::ptime::normalize(local_1c0);
          local_1c0[0].sec = local_1c0[0].sec + auVar10._0_8_;
          local_1c0[0].nsec = local_1c0[0].nsec + auVar10._8_4_;
          booster::ptime::normalize(local_1c0);
          if ((local_1c0[0].sec <= occured1_at.sec) &&
             ((local_1c0[0].sec < occured1_at.sec || (local_1c0[0].nsec <= occured1_at.nsec)))) {
            local_1c0[0].sec = 0;
            local_1c0[0].nsec = 300000000;
            booster::ptime::normalize(local_1c0);
            local_1c0[0].sec = auVar10._0_8_ + local_1c0[0].sec;
            local_1c0[0].nsec = auVar10._8_4_ + local_1c0[0].nsec;
            booster::ptime::normalize(local_1c0);
            if ((local_1c0[0].sec <= occured2_at.sec) &&
               ((local_1c0[0].sec < occured2_at.sec || (local_1c0[0].nsec <= occured2_at.nsec)))) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c0,
                         "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                         ,0x6c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
              poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x4f);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar2," occured2_at < now + ptime::milliseconds(300)",0x2d);
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar3,local_48);
              __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            booster::aio::deadline_timer::~deadline_timer(local_220);
            booster::aio::io_service::~io_service(local_1f8);
            booster::aio::deadline_timer::~deadline_timer(local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
            std::ostream::put('\0');
            std::ostream::flush();
            return 0;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x4e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," occured1_at >= now + ptime::milliseconds(100)",0x2e);
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar3,local_48);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                 ,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x37);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,
                 " (tmp = timer.expires_from_now()) <= ptime::seconds(2) && tmp >= ptime::milliseconds(1900)"
                 ,0x5a);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_220);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
             ,0x6c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             " (tmp = timer.expires_from_now()) <= ptime::milliseconds(1000) && tmp >=ptime::milliseconds(900)"
             ,0x60);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,(string *)local_220);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		using booster::ptime;
		booster::aio::deadline_timer timer;
		booster::ptime now=booster::ptime::now(),tmp;
		timer.expires_at(now + ptime::seconds(1));
		TEST(timer.expires_at() == now + ptime::seconds(1));
		TEST((tmp = timer.expires_from_now()) <= ptime::milliseconds(1000) && tmp >=ptime::milliseconds(900));
		timer.expires_from_now(ptime::milliseconds(2000));
		TEST((tmp = timer.expires_at()) >= now + ptime::seconds(2));
		TEST(tmp <= now + ptime::milliseconds(2100));
		TEST((tmp = timer.expires_from_now()) <= ptime::seconds(2) && tmp >= ptime::milliseconds(1900));
		
		now = booster::ptime::now();
		timer.expires_from_now(ptime::milliseconds(100));
		timer.wait();
		TEST( (tmp = (booster::ptime::now() - now)) >= ptime::milliseconds(100));
		TEST( tmp < ptime::milliseconds(300));

		booster::aio::io_service srv;
		timer.set_io_service(srv);
		booster::aio::deadline_timer t2(srv);
		
		now = booster::ptime::now();


		t2.expires_from_now(ptime::seconds(2));
		timer.expires_from_now(ptime::milliseconds(100));
		time1 exec1 = { &srv, &t2 };
		time2 exec2 = { &srv };
		timer.async_wait(exec1);
		t2.async_wait(exec2);
		srv.run();
		TEST(occured2_at >= occured1_at);
		TEST(occured1_at >= now + ptime::milliseconds(100));
		TEST(occured2_at < now + ptime::milliseconds(300));
	}
	catch(std::exception const &e)
	{
		std::cerr << "Fail: " <<e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}